

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall
mjs::parser::parser(parser *this,shared_ptr<mjs::source_file> *source,parse_mode mode)

{
  version ver;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  wstring_view local_30;
  
  peVar2 = (source->super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  p_Var1 = (source->super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
      peVar2 = (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  ver = peVar2->ver_;
  this->version_ = ver;
  local_30._M_str = (peVar2->text_)._M_dataplus._M_p;
  local_30._M_len = (peVar2->text_)._M_string_length;
  lexer::lexer(&this->lexer_,&local_30,ver);
  this->strict_mode_ = mode != non_strict;
  this->skip_strict_checks_for_first_function_ = mode == function_constructor_in_strict_context;
  *(undefined8 *)&this->token_start_ = 0;
  *(undefined8 *)((long)&this->expression_pos_ + 4) = 0;
  *(undefined8 *)((long)&this->statement_pos_ + 2) = 0;
  (this->current_token_).type_ = eof;
  check_token(this);
  return;
}

Assistant:

explicit parser(const std::shared_ptr<source_file>& source, parse_mode mode)
        : source_(source)
        , version_(source_->language_version())
        , lexer_(source_->text(), version_)
        , strict_mode_(mode != parse_mode::non_strict)
        , skip_strict_checks_for_first_function_(mode == parse_mode::function_constructor_in_strict_context) {
        check_token();
    }